

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# troposphere.cpp
# Opt level: O0

double Hopefield(double E,double H,double t0,double p0,double RH0)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double right;
  double left;
  double Kw;
  double Kd;
  double hd;
  double e;
  double T;
  double p;
  double RH;
  double T0;
  double H0;
  double hw;
  double E1;
  double RH0_local;
  double p0_local;
  double t0_local;
  double H_local;
  double E_local;
  
  dVar1 = Rad2Deg(E);
  dVar2 = exp((H - 0.0) * -0.0006396);
  dVar3 = pow((H - 0.0) * -2.26e-05 + 1.0,5.225);
  dVar4 = (H - 0.0) * -0.0065 + t0 + 273.16;
  dVar5 = exp(-(dVar4 * 0.000256908) * dVar4 + dVar4 * 0.213166 + -37.2465);
  dVar6 = sqrt(dVar1 * dVar1 + 6.25);
  dVar6 = Deg2Rad(dVar6);
  dVar6 = sin(dVar6);
  dVar1 = sqrt(dVar1 * dVar1 + 2.25);
  dVar1 = Deg2Rad(dVar1);
  dVar1 = sin(dVar1);
  return (((p0 * dVar3 * 1.552e-05) / dVar4) * ((((t0 + 273.16) - 273.16) * 148.72 + 40136.0) - H))
         / dVar6 + ((0.0746512 / (dVar4 * dVar4)) * RH0 * dVar2 * dVar5 * (11000.0 - H)) / dVar1;
}

Assistant:

double Hopefield(const double E, const double H, double t0,
                 double p0, double RH0)
{
    double E1 = Rad2Deg(E);
    double hw = 11000, H0 = 0.0;
    double T0 = t0 + 273.16;
    double RH = RH0 * exp(-0.0006396 * (H - H0));
    double p = p0 * pow(1 - 0.0000226 * (H - H0), 5.225);
    double T = T0 - 0.0065 * (H - H0);
    double e = RH * exp(-37.2465 + 0.213166 * T - 0.000256908 * T * T);
    double hd = 40136 + 148.72 * (T0 - 273.16);
    double Kd = 155.2e-7 * p / T * (hd - H);
    double Kw = 155.2e-7 * 4810.0 / (T * T) * e * (hw - H);
    double left = Kd / sin(Deg2Rad(sqrt(E1 * E1 + 6.25)));
    double right = Kw / sin(Deg2Rad(sqrt(E1 * E1 + 2.25)));
    return left + right;
}